

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entt.hpp
# Opt level: O1

value_type * __thiscall
entt::basic_storage<entt::entity,Components::Transform,std::allocator<Components::Transform>,void>::
emplace<Components::Transform_const&>
          (basic_storage<entt::entity,Components::Transform,std::allocator<Components::Transform>,void>
           *this,entity_type entt,Transform *args)

{
  value_type pTVar1;
  char *pcVar2;
  int __c;
  char *pos;
  
  pos = (char *)(*(long *)(this + 0x28) - *(long *)(this + 0x20) >> 2);
  if ((char *)((ulong)*(uint *)(this + 0x40) & 0xfffff) != (char *)0xfffff) {
    pos = (char *)((ulong)*(uint *)(this + 0x40) & 0xfffff);
  }
  pTVar1 = basic_storage<entt::entity,_Components::Transform,_std::allocator<Components::Transform>,_void>
           ::assure_at_least((basic_storage<entt::entity,_Components::Transform,_std::allocator<Components::Transform>,_void>
                              *)this,(size_t)pos);
  *pTVar1 = *args;
  basic_sparse_set<entt::entity,_std::allocator<entt::entity>_>::try_emplace
            ((basic_sparse_set<entt::entity,_std::allocator<entt::entity>_> *)this,entt,(void *)0x0)
  ;
  pcVar2 = basic_sparse_set<entt::entity,_std::allocator<entt::entity>_>::index
                     ((basic_sparse_set<entt::entity,_std::allocator<entt::entity>_> *)this,
                      (char *)(ulong)entt,__c);
  if (pos == pcVar2) {
    return pTVar1;
  }
  __assert_fail("pos == base_type::index(entt)",
                "/workspace/llm4binary/github/license_c_cmakelists/Green-Sky[P]imgui_entt_entity_editor_demo/external/entt/./single_include/entt/entt.hpp"
                ,0x409d,
                "value_type &entt::basic_storage<entt::entity, Components::Transform>::emplace(const entity_type, Args &&...) [Entity = entt::entity, Type = Components::Transform, Allocator = std::allocator<Components::Transform>, Args = <const Components::Transform &>]"
               );
}

Assistant:

value_type &emplace(const entity_type entt, Args &&...args) {
        const auto pos = base_type::slot();
        auto elem = assure_at_least(pos);
        construct(elem, std::forward<Args>(args)...);

        ENTT_TRY {
            base_type::try_emplace(entt);
            ENTT_ASSERT(pos == base_type::index(entt), "Misplaced component");
        }